

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

void __thiscall
slang::ast::Expression::PropagationVisitor::updateRange(PropagationVisitor *this,Expression *expr)

{
  SourceLocation SVar1;
  
  (this->opRange).startLoc = (SourceLocation)0x0;
  (this->opRange).endLoc = (SourceLocation)0x0;
  if (expr->kind == ConditionalOp) {
    SVar1 = (SourceLocation)expr[1].constant;
    (this->opRange).startLoc = SVar1;
    (this->opRange).endLoc =
         (SourceLocation)
         ((long)SVar1 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
         (ulong)(SVar1._0_4_ & 0xfffffff));
  }
  else if (expr->kind == BinaryOp) {
    SVar1 = expr[1].sourceRange.startLoc;
    (this->opRange).startLoc = (SourceLocation)expr[1].syntax;
    (this->opRange).endLoc = SVar1;
    return;
  }
  return;
}

Assistant:

void updateRange(const Expression& expr) {
        opRange = {};
        switch (expr.kind) {
            case ExpressionKind::BinaryOp:
                opRange = expr.as<BinaryExpression>().opRange;
                break;
            case ExpressionKind::ConditionalOp: {
                auto opLoc = expr.as<ConditionalExpression>().opLoc;
                opRange = {opLoc, opLoc + 1};
                break;
            }
            default:
                break;
        }
    }